

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cuboctahedron.cpp
# Opt level: O2

void __thiscall
OpenMD::Cuboctahedron::Cuboctahedron(Cuboctahedron *this,string *lattice,int cells,int planes)

{
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *this_00;
  bool bVar1;
  Vector<double,_3U> local_48;
  
  this->_vptr_Cuboctahedron = (_func_int **)&PTR__Cuboctahedron_002079d0;
  std::__cxx11::string::string((string *)&this->lattice_,(string *)lattice);
  this->L_ = cells;
  this->M_ = planes;
  this_00 = &this->Basis;
  (this->Points).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Points).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Points).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Basis).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Basis).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Basis).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::locale::locale((locale *)&local_48);
  toUpper<std::__cxx11::string>(lattice,(locale *)&local_48);
  std::locale::~locale((locale *)&local_48);
  bVar1 = std::operator==(lattice,"BCC");
  if (bVar1) {
    Vector<double,_3U>::Vector(&local_48);
    local_48.data_[0] = 0.0;
    local_48.data_[1] = 0.0;
    local_48.data_[2] = 0.0;
    std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
    emplace_back<OpenMD::Vector3<double>>
              ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)this_00,
               (Vector3<double> *)&local_48);
    Vector<double,_3U>::Vector(&local_48);
    local_48.data_[0] = 0.5;
    local_48.data_[1] = 0.5;
    local_48.data_[2] = 0.5;
    std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
    emplace_back<OpenMD::Vector3<double>>
              ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)this_00,
               (Vector3<double> *)&local_48);
  }
  else {
    bVar1 = std::operator==(lattice,"SC");
    if (bVar1) {
      Vector<double,_3U>::Vector(&local_48);
      local_48.data_[0] = 0.0;
      local_48.data_[1] = 0.0;
      local_48.data_[2] = 0.0;
      std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
      emplace_back<OpenMD::Vector3<double>>
                ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)this_00,
                 (Vector3<double> *)&local_48);
    }
    else {
      Vector<double,_3U>::Vector(&local_48);
      local_48.data_[0] = 0.0;
      local_48.data_[1] = 0.0;
      local_48.data_[2] = 0.0;
      std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
      emplace_back<OpenMD::Vector3<double>>
                ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)this_00,
                 (Vector3<double> *)&local_48);
      Vector<double,_3U>::Vector(&local_48);
      local_48.data_[0] = 0.5;
      local_48.data_[1] = 0.5;
      local_48.data_[2] = 0.0;
      std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
      emplace_back<OpenMD::Vector3<double>>
                ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)this_00,
                 (Vector3<double> *)&local_48);
      Vector<double,_3U>::Vector(&local_48);
      local_48.data_[0] = 0.5;
      local_48.data_[1] = 0.0;
      local_48.data_[2] = 0.5;
      std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
      emplace_back<OpenMD::Vector3<double>>
                ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)this_00,
                 (Vector3<double> *)&local_48);
      Vector<double,_3U>::Vector(&local_48);
      local_48.data_[0] = 0.0;
      local_48.data_[1] = 0.5;
      local_48.data_[2] = 0.5;
      std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
      emplace_back<OpenMD::Vector3<double>>
                ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)this_00,
                 (Vector3<double> *)&local_48);
    }
  }
  return;
}

Assistant:

Cuboctahedron::Cuboctahedron(std::string lattice, int cells, int planes) :
      lattice_(lattice), L_(cells), M_(planes) {
    Basis.clear();
    Points.clear();

    //
    // Initialize Basis vectors.
    //
    toUpper(lattice);

    if (lattice == "BCC") {
      Basis.push_back(Vector3d(0.0, 0.0, 0.0));
      Basis.push_back(Vector3d(0.5, 0.5, 0.5));
    } else if (lattice == "SC") {
      Basis.push_back(Vector3d(0.0, 0.0, 0.0));
    } else {
      // Default is FCC:
      Basis.push_back(Vector3d(0.0, 0.0, 0.0));
      Basis.push_back(Vector3d(0.5, 0.5, 0.0));
      Basis.push_back(Vector3d(0.5, 0.0, 0.5));
      Basis.push_back(Vector3d(0.0, 0.5, 0.5));
    }
  }